

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
PAdminMsgIRCCommand::trigger
          (PAdminMsgIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  string_view name;
  char cVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  uint uVar7;
  string msg;
  string_view nick_local;
  string local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  
  pcVar6 = nick._M_str;
  sVar5 = nick._M_len;
  msg._M_dataplus._M_p = (pointer)parameters._M_len;
  msg._M_string_length = (size_type)parameters._M_str;
  local_70._M_dataplus._M_p = (pointer)0x2;
  local_70._M_string_length = 0x13bb6d;
  nick_local._M_len = sVar5;
  nick_local._M_str = pcVar6;
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&command_split,(basic_string_view<char,_std::char_traits<char>_> *)&msg,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_70);
  if (command_split.second._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,sVar5,pcVar6,0x3b,
               "Error: Too Few Parameters. Syntax: pamsg <Player> <Message>");
  }
  else {
    Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    Jupiter::IRC::Client::Channel::getType();
    name._M_str = command_split.first._M_str;
    name._M_len = command_split.first._M_len;
    msg._M_dataplus._M_p = (pointer)&msg.field_2;
    msg._M_string_length = 0;
    msg.field_2._M_local_buf[0] = '\0';
    uVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    cVar1 = Jupiter::IRC::Client::Channel::getUserPrefix(uVar2,sVar5,pcVar6);
    if (cVar1 != '\0') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&msg,cVar1);
    }
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,&nick_local);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&msg,"@IRC: ");
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&msg,&command_split.second);
    if (parameters._M_len != 0) {
      uVar7 = 0;
      while( true ) {
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        if (uVar3 == uVar7) break;
        uVar3 = RenX::getCore();
        uVar2 = RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)uVar2);
        if (cVar1 != '\0') {
          lVar4 = RenX::Server::getPlayerByPartName
                            (uVar2,command_split.first._M_len,command_split.first._M_str);
          pcVar6 = nick_local._M_str;
          sVar5 = nick_local._M_len;
          if (lVar4 == 0) {
            player_not_found_message_abi_cxx11_(&local_70,name);
            Jupiter::IRC::Client::sendNotice
                      (source,sVar5,pcVar6,local_70._M_string_length,local_70._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_70);
          }
          else {
            RenX::Server::sendAdminMessage(uVar2,lVar4,msg._M_string_length,msg._M_dataplus._M_p);
          }
        }
        uVar7 = uVar7 + 1;
      }
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void PAdminMsgIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!command_split.second.empty()) {
		int type = source->getChannel(channel)->getType();
		std::string_view name = command_split.first;
		RenX::PlayerInfo *player;
		std::string msg;
		char prefix = source->getChannel(channel)->getUserPrefix(nick);
		if (prefix != '\0')
			msg += prefix;
		msg += nick;
		msg += "@IRC: ";
		msg += command_split.second;
		if (!parameters.empty())
		{
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					player = server->getPlayerByPartName(name);
					if (player != nullptr)
						server->sendAdminMessage(*player, msg);
					else source->sendNotice(nick, player_not_found_message(name));
				}
			}
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: pamsg <Player> <Message>"sv);
}